

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O3

_Bool PPC_abs_branch(cs_struct *h,uint id)

{
  uint *puVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  do {
    puVar1 = (uint *)((long)insn_abs + lVar2);
    if (*puVar1 == id) break;
    bVar3 = lVar2 != 0x40;
    lVar2 = lVar2 + 4;
  } while (bVar3);
  return *puVar1 == id;
}

Assistant:

bool PPC_abs_branch(cs_struct *h, unsigned int id)
{
	int i;

	for (i = 0; insn_abs[i]; i++) {
		if (id == insn_abs[i]) {
			return true;
		}
	}

	// not found
	return false;
}